

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Descriptor.cpp
# Opt level: O2

TypeDescriptor * addOperator(TypeDescriptor *leftValue,TypeDescriptor *rightValue)

{
  StringDescriptor *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (leftValue->_type == NUMBER) {
    this = (StringDescriptor *)operator_new(0x60);
    NumberDescriptor::NumberDescriptor
              ((NumberDescriptor *)this,leftValue->_number + rightValue->_number);
  }
  else {
    this = (StringDescriptor *)operator_new(0x78);
    std::__cxx11::string::string((string *)&local_58,(string *)&leftValue->_string);
    std::__cxx11::string::string((string *)&bStack_78,(string *)&rightValue->_string);
    std::operator+(&local_38,&local_58,&bStack_78);
    StringDescriptor::StringDescriptor(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&bStack_78);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return &this->super_TypeDescriptor;
}

Assistant:

TypeDescriptor *addOperator(TypeDescriptor *leftValue, TypeDescriptor *rightValue){
    if(leftValue->type() == TypeDescriptor::NUMBER){
        auto *numSum = new  NumberDescriptor(leftValue->getNumber() + rightValue->getNumber());
        //std::cout << "TypeDescriptor* addOperator: " << leftValue->getNumber() << " + " << rightValue->getNumber() << std::endl;
        return numSum;
    }else if(leftValue->STRING){

        auto *stringSum = new StringDescriptor( leftValue->getString()  + rightValue->getString() );
        return stringSum;
    }else{
        std::cout << "Unknown type. Terminating" << std::endl;
        exit(2);
    }
}